

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileColliderTests.cpp
# Opt level: O2

void __thiscall
solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests_getUncoveredCardsPosition_Test
::TestBody(StockPileColliderGetUncoveredCardsPositionTests_getUncoveredCardsPosition_Test *this)

{
  ParamType *pPVar1;
  TypedExpectation<std::optional<unsigned_int>_()> *this_00;
  StockPileMock *in_RSI;
  char *message;
  AssertHelper local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  MockSpec<std::optional<unsigned_int>_()> local_50;
  AssertionResult gtest_ar;
  
  pPVar1 = testing::WithParamInterface<solitaire::colliders::UncoveredPileCardsPositionData>::
           GetParam();
  local_50.function_mocker_ =
       (FunctionMocker<std::optional<unsigned_int>_()> *)
       piles::StockPileMock::gmock_getSelectedCardIndex
                 ((MockSpec<std::optional<unsigned_int>_()> *)
                  &(this->super_StockPileColliderGetUncoveredCardsPositionTests).
                   super_StockPileColliderTests.stockPileMock,in_RSI);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<std::optional<unsigned_int>_()>::InternalExpectedAt
                      (&local_50,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/colliders/StockPileColliderTests.cpp"
                       ,0x75,"stockPileMock","getSelectedCardIndex()");
  testing::internal::ReturnAction<std::optional<unsigned_int>_>::ReturnAction
            ((ReturnAction<std::optional<unsigned_int>_> *)&local_60,
             (optional<unsigned_int>)
             (pPVar1->selectedCardIndex).super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<std::optional<unsigned_int>_()> *)&gtest_ar,(ReturnAction *)&local_60);
  testing::internal::TypedExpectation<std::optional<unsigned_int>_()>::WillOnce
            (this_00,(Action<std::optional<unsigned_int>_()> *)&gtest_ar);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  local_50.function_mocker_ =
       (FunctionMocker<std::optional<unsigned_int>_()> *)
       StockPileCollider::getUncoveredCardsPosition
                 (&(this->super_StockPileColliderGetUncoveredCardsPositionTests).
                   super_StockPileColliderTests.collider);
  testing::internal::CmpHelperEQ<solitaire::geometry::Position,solitaire::geometry::Position>
            ((internal *)&gtest_ar,"collider.getUncoveredCardsPosition()",
             "uncoveredCardsPositionData.position",(Position *)&local_50,&pPVar1->position);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/colliders/StockPileColliderTests.cpp"
               ,0x7b,message);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((Position)local_50.function_mocker_ != (Position)0x0) {
      (**(code **)(*(long *)local_50.function_mocker_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_P(StockPileColliderGetUncoveredCardsPositionTests, getUncoveredCardsPosition) {
    const auto& uncoveredCardsPositionData = GetParam();
    EXPECT_CALL(stockPileMock, getSelectedCardIndex())
        .WillOnce(Return(uncoveredCardsPositionData.selectedCardIndex));

    EXPECT_EQ(
        collider.getUncoveredCardsPosition(),
        uncoveredCardsPositionData.position
    );
}